

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x8b38b8;
  *(undefined8 *)&this->field_0x1c0 = 0x8b3a20;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x8b38e0;
  (this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b3908;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x8b3930;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8b3958;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x138 = 0x8b3980;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x148 = 0x8b39a8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    field_0x158 = 0x8b39d0;
  *(undefined8 *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.field_0x168 =
       0x8b39f8;
  pcVar2 = (this->UserDefinedFunction).ptr._M_dataplus._M_p;
  paVar1 = &(this->UserDefinedFunction).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcFlowController).field_0x178;
  if (puVar3 != &this->field_0x188) {
    operator_delete(puVar3,*(long *)&this->field_0x188 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__008b3a50);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}